

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::OnImportMemory
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits)

{
  Enum EVar1;
  char buf [100];
  
  anon_unknown_22::SPrintLimits(buf,(size_t)page_limits,(Limits *)module_name.data_);
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnImportMemory(import_index: %u, memory_index: %u, %s)\n",
                 (ulong)import_index,(ulong)memory_index,buf);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x14])
                    (this->reader_,(ulong)import_index,(Limits *)module_name.data_,module_name.size_
                     ,field_name.data_,field_name.size_,(ulong)memory_index,page_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportMemory(Index import_index,
                                           string_view module_name,
                                           string_view field_name,
                                           Index memory_index,
                                           const Limits* page_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), page_limits);
  LOGF("OnImportMemory(import_index: %" PRIindex ", memory_index: %" PRIindex
       ", %s)\n",
       import_index, memory_index, buf);
  return reader_->OnImportMemory(import_index, module_name, field_name,
                                 memory_index, page_limits);
}